

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<float,_duckdb::ModeStandard<float>_>::ModeRm
          (ModeState<float,_duckdb::ModeStandard<float>_> *this,idx_t frame)

{
  __buckets_ptr pp_Var1;
  float *pfVar2;
  float *pfVar3;
  mapped_type *pmVar4;
  unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
  *in_RDI;
  size_t old_count;
  mapped_type *attr;
  float *key;
  key_type *in_stack_ffffffffffffffc8;
  idx_t in_stack_ffffffffffffffd8;
  ModeState<float,_duckdb::ModeStandard<float>_> *in_stack_ffffffffffffffe0;
  
  pfVar3 = GetCell(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pmVar4 = std::
           unordered_map<float,_duckdb::ModeAttr,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>_>
           ::operator[](in_RDI,in_stack_ffffffffffffffc8);
  pp_Var1 = (__buckets_ptr)pmVar4->count;
  (in_RDI->_M_h)._M_rehash_policy._M_next_resize =
       (in_RDI->_M_h)._M_rehash_policy._M_next_resize - (ulong)(pp_Var1 == (__buckets_ptr)0x1);
  pmVar4->count = pmVar4->count - 1;
  if (((in_RDI[1]._M_h._M_buckets == pp_Var1) &&
      (pfVar2 = *(float **)&(in_RDI->_M_h)._M_rehash_policy, *pfVar3 == *pfVar2)) &&
     (!NAN(*pfVar3) && !NAN(*pfVar2))) {
    *(undefined1 *)&(in_RDI->_M_h)._M_single_bucket = 0;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}